

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::post_torrent_updates(session_impl *this,status_flags_t flags)

{
  torrent *this_00;
  bool bVar1;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *this_01;
  size_type __n;
  reference pptVar2;
  reference st;
  torrent **t;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *__range2;
  undefined1 local_40 [8];
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> status;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *state_updates;
  session_impl *this_local;
  status_flags_t flags_local;
  
  status.super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_01 = &container_wrapper<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>_>
             ::operator[](&this->m_torrent_lists,
                          (strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>)0x0)->
             super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>;
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::vector
            ((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_40);
  __n = ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::size
                  (this_01);
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::reserve
            ((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_40,__n);
  __end2 = ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
           begin(this_01);
  t = (torrent **)
      ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::end
                (this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                                *)&t);
    if (!bVar1) break;
    pptVar2 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
              ::operator*(&__end2);
    ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::
    emplace_back<>((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>
                    *)local_40);
    this_00 = *pptVar2;
    st = ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::
         back((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
              local_40);
    torrent::status(this_00,st,flags);
    torrent::clear_in_state_update(*pptVar2);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
    ::operator++(&__end2);
  }
  ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::clear
            (this_01);
  alert_manager::
  emplace_alert<libtorrent::state_update_alert,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>>
            (&this->m_alerts,
             (vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_40);
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::~vector
            ((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_40);
  return;
}

Assistant:

void session_impl::post_torrent_updates(status_flags_t const flags)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(is_single_thread());

		std::vector<torrent*>& state_updates
			= m_torrent_lists[aux::session_impl::torrent_state_updates];

#if TORRENT_USE_ASSERTS
		m_posting_torrent_updates = true;
#endif

		std::vector<torrent_status> status;
		status.reserve(state_updates.size());

		// TODO: it might be a nice feature here to limit the number of torrents
		// to send in a single update. By just posting the first n torrents, they
		// would nicely be round-robined because the torrent lists are always
		// pushed back. Perhaps the status_update_alert could even have a fixed
		// array of n entries rather than a vector, to further improve memory
		// locality.
		for (auto& t : state_updates)
		{
			TORRENT_ASSERT(t->m_links[aux::session_impl::torrent_state_updates].in_list());
			status.emplace_back();
			// querying accurate download counters may require
			// the torrent to be loaded. Loading a torrent, and evicting another
			// one will lead to calling state_updated(), which screws with
			// this list while we're working on it, and break things
			t->status(&status.back(), flags);
			t->clear_in_state_update();
		}
		state_updates.clear();

#if TORRENT_USE_ASSERTS
		m_posting_torrent_updates = false;
#endif

		m_alerts.emplace_alert<state_update_alert>(std::move(status));
	}